

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     sort2<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
               (pair<double,_int> *a,pair<double,_int> *b)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = std::operator<(b,a);
  if (bVar3) {
    dVar1 = a->first;
    a->first = b->first;
    b->first = dVar1;
    iVar2 = a->second;
    a->second = b->second;
    b->second = iVar2;
  }
  return;
}

Assistant:

inline void sort2(Iter a, Iter b, Compare comp) {
        if (comp(*b, *a)) std::iter_swap(a, b);
    }